

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

ScanResult * __thiscall
wallet::CWallet::ScanForWalletTransactions
          (ScanResult *__return_storage_ptr__,CWallet *this,uint256 *start_block,int start_height,
          optional<int> max_height,WalletRescanReserver *reserver,bool fUpdate,bool save_progress)

{
  uint256 *puVar1;
  _Rb_tree_header *p_Var2;
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  *this_00;
  long lVar3;
  uchar *puVar4;
  long lVar5;
  Chain *pCVar6;
  pointer pcVar7;
  WalletDatabase *pWVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  base_blob<256U> *pbVar13;
  undefined8 uVar14;
  char cVar15;
  bool bVar16;
  bool bVar17;
  int iVar18;
  int32_t iVar19;
  uint uVar20;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar21;
  FastWalletRescanFilter *this_01;
  DescriptorScriptPubKeyMan *pDVar22;
  _Rb_tree_node_base *p_Var23;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar24;
  ScriptPubKeyMan *pSVar25;
  mapped_type_conflict *pmVar26;
  _Rb_tree_node_base *p_Var27;
  Logger *pLVar28;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar29;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar30;
  char *__ptr;
  CTransactionRef *ptx;
  ulong uVar31;
  long lVar32;
  long in_FS_OFFSET;
  double dVar33;
  undefined8 uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  ScanResult *args;
  undefined4 uVar37;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 uVar38;
  ElementSet *in_stack_fffffffffffffda8;
  RecursiveMutex *pRVar39;
  duration local_248;
  double local_1f8;
  WalletBatch local_1d0;
  bool next_block;
  bool block_still_active;
  int block_height;
  uint256 prev_tip_hash;
  undefined1 auStack_198 [8];
  undefined1 local_190 [8];
  undefined1 auStack_188 [8];
  undefined1 local_180 [16];
  undefined8 local_170;
  undefined1 local_168 [19];
  undefined8 uStack_155;
  CBlockLocator loc;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  undefined1 local_e8 [16];
  uint256 next_block_hash;
  uint256 end_hash;
  uint256 tip_hash;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  uint256 block_hash;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
    local_248.__r = std::chrono::_V2::steady_clock::now();
  }
  else {
    local_248.__r = (rep)(*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
  }
  if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
    tVar21.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  else {
    tVar21 = (*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
  }
  if ((reserver->m_could_reserve != true) ||
     (((reserver->m_wallet->fScanningWallet)._M_base._M_i & 1U) == 0)) {
    __assert_fail("reserver.isReserved()",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x75a,
                  "CWallet::ScanResult wallet::CWallet::ScanForWalletTransactions(const uint256 &, int, std::optional<int>, const WalletRescanReserver &, bool, const bool)"
                 );
  }
  block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       *(undefined8 *)(start_block->super_base_blob<256U>).m_data._M_elems;
  block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 8);
  block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x10);
  block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((start_block->super_base_blob<256U>).m_data._M_elems + 0x18);
  (__return_storage_ptr__->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int>._M_engaged = false;
  puVar1 = &__return_storage_ptr__->last_failed_block;
  (puVar1->super_base_blob<256U>).m_data._M_elems[0] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[1] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[2] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[3] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[4] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[5] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[6] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[7] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[8] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[9] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[10] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xb] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xc] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xd] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xe] = '\0';
  (puVar1->super_base_blob<256U>).m_data._M_elems[0xf] = '\0';
  pbVar13 = &(__return_storage_ptr__->last_failed_block).super_base_blob<256U>;
  (pbVar13->m_data)._M_elems[0x10] = '\0';
  (pbVar13->m_data)._M_elems[0x11] = '\0';
  (pbVar13->m_data)._M_elems[0x12] = '\0';
  (pbVar13->m_data)._M_elems[0x13] = '\0';
  (pbVar13->m_data)._M_elems[0x14] = '\0';
  (pbVar13->m_data)._M_elems[0x15] = '\0';
  (pbVar13->m_data)._M_elems[0x16] = '\0';
  (pbVar13->m_data)._M_elems[0x17] = '\0';
  (pbVar13->m_data)._M_elems[0x18] = '\0';
  (pbVar13->m_data)._M_elems[0x19] = '\0';
  (pbVar13->m_data)._M_elems[0x1a] = '\0';
  (pbVar13->m_data)._M_elems[0x1b] = '\0';
  (pbVar13->m_data)._M_elems[0x1c] = '\0';
  (pbVar13->m_data)._M_elems[0x1d] = '\0';
  (pbVar13->m_data)._M_elems[0x1e] = '\0';
  (pbVar13->m_data)._M_elems[0x1f] = '\0';
  __return_storage_ptr__->status = SUCCESS;
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[0] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[1] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[2] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[3] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[4] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[5] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[6] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[7] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[8] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[9] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[10] = '\0';
  (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  pbVar13 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar13->m_data)._M_elems[0xc] = '\0';
  (pbVar13->m_data)._M_elems[0xd] = '\0';
  (pbVar13->m_data)._M_elems[0xe] = '\0';
  (pbVar13->m_data)._M_elems[0xf] = '\0';
  (pbVar13->m_data)._M_elems[0x10] = '\0';
  (pbVar13->m_data)._M_elems[0x11] = '\0';
  (pbVar13->m_data)._M_elems[0x12] = '\0';
  (pbVar13->m_data)._M_elems[0x13] = '\0';
  (pbVar13->m_data)._M_elems[0x14] = '\0';
  (pbVar13->m_data)._M_elems[0x15] = '\0';
  (pbVar13->m_data)._M_elems[0x16] = '\0';
  (pbVar13->m_data)._M_elems[0x17] = '\0';
  (pbVar13->m_data)._M_elems[0x18] = '\0';
  (pbVar13->m_data)._M_elems[0x19] = '\0';
  (pbVar13->m_data)._M_elems[0x1a] = '\0';
  (pbVar13->m_data)._M_elems[0x1b] = '\0';
  pbVar13 = &(__return_storage_ptr__->last_scanned_block).super_base_blob<256U>;
  (pbVar13->m_data)._M_elems[0x1c] = '\0';
  (pbVar13->m_data)._M_elems[0x1d] = '\0';
  (pbVar13->m_data)._M_elems[0x1e] = '\0';
  (pbVar13->m_data)._M_elems[0x1f] = '\0';
  if (((this->m_wallet_flags).super___atomic_base<unsigned_long>._M_i >> 0x22 & 1) == 0) {
LAB_00161316:
    this_01 = (FastWalletRescanFilter *)0x0;
  }
  else {
    pCVar6 = this->m_chain;
    if (pCVar6 == (Chain *)0x0) goto LAB_00162613;
    cVar15 = (**(code **)(*(long *)pCVar6 + 0x40))(pCVar6,0);
    if (cVar15 == '\0') goto LAB_00161316;
    this_01 = (FastWalletRescanFilter *)operator_new(0x80);
    this_01->m_wallet = this;
    p_Var2 = &(this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header;
    (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var2->_M_header;
    (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var2->_M_header;
    (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    in_stack_fffffffffffffda8 = &this_01->m_filter_set;
    ByteVectorHash::ByteVectorHash((ByteVectorHash *)in_stack_fffffffffffffda8);
    (this_01->m_filter_set)._M_h._M_buckets = &(this_01->m_filter_set)._M_h._M_single_bucket;
    (this_01->m_filter_set)._M_h._M_bucket_count = 1;
    (this_01->m_filter_set)._M_h._M_before_begin = (_Hash_node_base *)0x0;
    (this_01->m_filter_set)._M_h._M_element_count = 0;
    (this_01->m_filter_set)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    *(undefined1 (*) [16])&(this_01->m_filter_set)._M_h._M_rehash_policy._M_next_resize =
         (undefined1  [16])0x0;
    if (((this_01->m_wallet->m_wallet_flags).super___atomic_base<unsigned_long>._M_i & 0x400000000)
        == 0) {
      __assert_fail("!m_wallet.IsLegacy()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x13d,
                    "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                   );
    }
    GetAllScriptPubKeyMans
              ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                *)&prev_tip_hash,this_01->m_wallet);
    p_Var27 = (_Rb_tree_node_base *)(prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 8);
    if ((_Rb_tree_node_base *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ != p_Var27)
    {
      p_Var23 = (_Rb_tree_node_base *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
      do {
        if ((*(long *)(p_Var23 + 1) == 0) ||
           (pDVar22 = (DescriptorScriptPubKeyMan *)
                      __dynamic_cast(*(long *)(p_Var23 + 1),&ScriptPubKeyMan::typeinfo,
                                     &DescriptorScriptPubKeyMan::typeinfo,0),
           pDVar22 == (DescriptorScriptPubKeyMan *)0x0)) {
          __assert_fail("desc_spkm != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                        ,0x142,
                        "wallet::(anonymous namespace)::FastWalletRescanFilter::FastWalletRescanFilter(const CWallet &)"
                       );
        }
        anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys(this_01,pDVar22,0);
        iVar18 = (*(pDVar22->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0xc])(pDVar22);
        if ((char)iVar18 != '\0') {
          (*(pDVar22->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])((uint256 *)&loc,pDVar22);
          iVar19 = DescriptorScriptPubKeyMan::GetEndRange(pDVar22);
          tip_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)iVar19;
          tip_hash.super_base_blob<256U>.m_data._M_elems[1] = (char)((uint)iVar19 >> 8);
          tip_hash.super_base_blob<256U>.m_data._M_elems[2] = (char)((uint)iVar19 >> 0x10);
          tip_hash.super_base_blob<256U>.m_data._M_elems[3] = (char)((uint)iVar19 >> 0x18);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
          ::_M_emplace_unique<uint256,int>
                    ((_Rb_tree<uint256,std::pair<uint256_const,int>,std::_Select1st<std::pair<uint256_const,int>>,std::less<uint256>,std::allocator<std::pair<uint256_const,int>>>
                      *)&this_01->m_last_range_ends,(uint256 *)&loc,(int *)&tip_hash);
        }
        p_Var23 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var23);
      } while (p_Var23 != p_Var27);
    }
    std::
    _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
    ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                 *)&prev_tip_hash);
  }
  base_blob<256u>::ToString_abi_cxx11_((string *)&local_78,start_block);
  parameters._M_string_length._0_4_ = start_height;
  parameters._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  parameters._M_string_length._4_4_ = in_stack_fffffffffffffda4;
  parameters.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffda8;
  parameters.field_2._8_4_ =
       max_height.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       ._M_payload;
  parameters.field_2._12_1_ =
       max_height.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       ._M_engaged;
  parameters.field_2._13_3_ =
       max_height.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>
       ._5_3_;
  WalletLogPrintf<std::__cxx11::string,char_const*>
            (this,"Rescan started from block %s... (%s)\n",parameters,local_78._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_allocated_capacity != &local_68) {
    operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
  }
  LOCK();
  (this->fAbortRescan)._M_base._M_i = false;
  UNLOCK();
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&prev_tip_hash,anon_var_dwarf_239dee,anon_var_dwarf_239dee + 0xd);
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    auStack_198 = (undefined1  [8])(local_190 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_198,anon_var_dwarf_239dee,anon_var_dwarf_239dee + 0xd);
  }
  else {
    end_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_239dee;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_198,
               (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&end_hash);
  }
  pbVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_198,0,0,"%s ",3);
  puVar4 = tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar24->_M_dataplus)._M_p;
  pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar24->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ == pbVar30) {
    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar30;
    tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((long)&pbVar24->field_2 + 8);
    tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar4;
  }
  else {
    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar30;
  }
  tip_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar24->_M_string_length;
  (pbVar24->_M_dataplus)._M_p = (pointer)pbVar30;
  pbVar24->_M_string_length = 0;
  (pbVar24->field_2)._M_local_buf[0] = '\0';
  GetDisplayName_abi_cxx11_((string *)&end_hash,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&tip_hash,(string *)&end_hash,pbVar30);
  this_00 = &this->ShowProgress;
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,0);
  if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super_base_blob<256U>).m_data._M_elems + 1));
  }
  if ((uchar *)end_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      end_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)end_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    end_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if ((uchar *)tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar4) {
    operator_delete((void *)tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if (auStack_198 != (undefined1  [8])(local_190 + 8)) {
    operator_delete((void *)auStack_198,(long)auStack_188 + 1);
  }
  if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  pRVar39 = &this->cs_wallet;
  auVar11[0xf] = 0;
  auVar11[0] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9];
  auVar11[1] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10];
  auVar11[2] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  auVar11[3] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  auVar11[4] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  auVar11[5] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  auVar11[6] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  auVar11[7] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  auVar11[8] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  auVar11[9] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  auVar11[10] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  auVar11[0xb] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  auVar11[0xc] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  auVar11[0xd] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  auVar11[0xe] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ = auVar11 << 8;
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = pRVar39;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&prev_tip_hash);
  if (this->m_last_block_processed_height < 0) {
LAB_001625ac:
    __assert_fail("m_last_block_processed_height >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x3d7,"uint256 wallet::CWallet::GetLastBlockHash() const");
  }
  tip_hash.super_base_blob<256U>.m_data._M_elems._0_16_ =
       *(undefined1 (*) [16])(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
  tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
       *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
  tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
       *(undefined8 *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)&prev_tip_hash);
  auVar11 = (undefined1  [16])tip_hash.super_base_blob<256U>.m_data._M_elems._0_16_;
  end_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x18];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x19];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
  end_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
  end_hash.super_base_blob<256U>.m_data._M_elems[0] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0];
  end_hash.super_base_blob<256U>.m_data._M_elems[1] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[1];
  end_hash.super_base_blob<256U>.m_data._M_elems[2] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[2];
  end_hash.super_base_blob<256U>.m_data._M_elems[3] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[3];
  end_hash.super_base_blob<256U>.m_data._M_elems[4] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[4];
  end_hash.super_base_blob<256U>.m_data._M_elems[5] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[5];
  end_hash.super_base_blob<256U>.m_data._M_elems[6] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[6];
  end_hash.super_base_blob<256U>.m_data._M_elems[7] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[7];
  end_hash.super_base_blob<256U>.m_data._M_elems[8] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[8];
  end_hash.super_base_blob<256U>.m_data._M_elems[9] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[9];
  end_hash.super_base_blob<256U>.m_data._M_elems[10] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[10];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
  end_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
       tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
  tip_hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar11;
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> >> 0x20 & 1) != 0) {
    pCVar6 = this->m_chain;
    if (pCVar6 == (Chain *)0x0) goto LAB_00162613;
    local_180 = (undefined1  [16])0x0;
    _local_190 = (undefined1  [16])0x0;
    stack0xfffffffffffffe60 = (undefined1  [16])0x0;
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_170 = 0;
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (string *)&end_hash;
    (**(code **)(*(long *)pCVar6 + 0x60))
              (pCVar6,&tip_hash,
               max_height.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>);
  }
  pCVar6 = this->m_chain;
  if (pCVar6 == (Chain *)0x0) {
LAB_00162613:
    __assert_fail("m_chain",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                  ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
  }
  dVar33 = (double)(**(code **)(*(long *)pCVar6 + 0x80))(pCVar6,&block_hash);
  pCVar6 = this->m_chain;
  if (pCVar6 == (Chain *)0x0) goto LAB_00162613;
  local_1f8 = (double)(**(code **)(*(long *)pCVar6 + 0x80))(pCVar6,&end_hash);
  uVar37 = SUB84(dVar33,0);
  uVar38 = (undefined4)((ulong)dVar33 >> 0x20);
  args = __return_storage_ptr__;
  block_height = start_height;
  if (((this->fAbortRescan)._M_base._M_i & 1U) == 0) {
    do {
      if (this->m_chain == (Chain *)0x0) goto LAB_00162613;
      cVar15 = (**(code **)(*(long *)this->m_chain + 0x120))();
      if (cVar15 != '\0') break;
      if (0.0 < local_1f8 - dVar33) {
        LOCK();
        (this->m_scanning_progress).super___atomic_float<double>._M_fp =
             ((double)CONCAT44(uVar38,uVar37) - dVar33) / (local_1f8 - dVar33);
        UNLOCK();
        if ((block_height * -0x3d70a3d7 + 0x51eb850U >> 2 | block_height * 0x40000000) < 0x28f5c29)
        {
          prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
               prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&prev_tip_hash,anon_var_dwarf_239dee,anon_var_dwarf_239dee + 0xd);
          if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
            auStack_198 = (undefined1  [8])(local_190 + 8);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)auStack_198,anon_var_dwarf_239dee,anon_var_dwarf_239dee + 0xd);
          }
          else {
            criticalblock43.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_239dee;
            (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_198,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,
                       (char **)&criticalblock43);
          }
          pbVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              auStack_198,0,0,"%s ",3);
          next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
               next_block_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
          pcVar7 = (pbVar24->_M_dataplus)._M_p;
          pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &pbVar24->field_2;
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar7 == pbVar30
             ) {
            next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar30;
            next_block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)((long)&pbVar24->field_2 + 8);
          }
          else {
            next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar30;
            next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = pcVar7;
          }
          next_block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar24->_M_string_length;
          (pbVar24->_M_dataplus)._M_p = (pointer)pbVar30;
          pbVar24->_M_string_length = 0;
          (pbVar24->field_2)._M_local_buf[0] = '\0';
          GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
          tinyformat::format<std::__cxx11::string>
                    ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,
                     pbVar30);
          iVar18 = (int)((this->m_scanning_progress).super___atomic_float<double>._M_fp * 100.0);
          if (0x62 < iVar18) {
            iVar18 = 99;
          }
          if (iVar18 < 2) {
            iVar18 = 1;
          }
          boost::signals2::
          signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
          ::operator()(this_00,(string *)&loc,iVar18);
          if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage) {
            operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (ulong)(((loc.vHave.
                                      super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage)->
                                    super_base_blob<256U>).m_data._M_elems + 1));
          }
          if (criticalblock43.super_unique_lock._M_device != (mutex_type *)local_e8) {
            operator_delete(criticalblock43.super_unique_lock._M_device,local_e8._0_8_ + 1);
          }
          if ((uchar *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
              next_block_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
            operator_delete((void *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                            next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
          }
          if (auStack_198 != (undefined1  [8])(local_190 + 8)) {
            operator_delete((void *)auStack_198,(long)auStack_188 + 1);
          }
          if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
              prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
            operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                            prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
          }
        }
      }
      else {
        LOCK();
        (this->m_scanning_progress).super___atomic_float<double>._M_fp = 0.0;
        UNLOCK();
      }
      if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
        tVar29.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      }
      else {
        tVar29 = (*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
      }
      lVar3 = local_248.__r + 60000000000;
      if (lVar3 <= (long)tVar29.__d.__r) {
        if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
          local_248.__r = std::chrono::_V2::steady_clock::now();
        }
        else {
          local_248.__r = (rep)(*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
        }
        WalletLogPrintf<int,double>
                  (this,"Still rescanning. At block %d. Progress=%f\n",block_height,
                   (double)CONCAT44(uVar38,uVar37));
      }
      bVar12 = true;
      bVar17 = bVar12;
      if (this_01 != (FastWalletRescanFilter *)0x0) {
        for (p_Var27 = (this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header._M_header.
                       _M_left;
            (_Rb_tree_header *)p_Var27 !=
            &(this_01->m_last_range_ends)._M_t._M_impl.super__Rb_tree_header;
            p_Var27 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var27)) {
          pSVar25 = GetScriptPubKeyMan(this_01->m_wallet,(uint256 *)(p_Var27 + 1));
          if ((pSVar25 == (ScriptPubKeyMan *)0x0) ||
             (pDVar22 = (DescriptorScriptPubKeyMan *)
                        __dynamic_cast(pSVar25,&ScriptPubKeyMan::typeinfo,
                                       &DescriptorScriptPubKeyMan::typeinfo,0),
             pDVar22 == (DescriptorScriptPubKeyMan *)0x0)) {
            __assert_fail("desc_spkm != nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
                          ,0x150,
                          "void wallet::(anonymous namespace)::FastWalletRescanFilter::UpdateIfNeeded()"
                         );
          }
          iVar19 = DescriptorScriptPubKeyMan::GetEndRange(pDVar22);
          if ((int)p_Var27[2]._M_color < iVar19) {
            anon_unknown_48::FastWalletRescanFilter::AddScriptPubKeys
                      (this_01,pDVar22,p_Var27[2]._M_color);
            (*(pDVar22->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&prev_tip_hash,pDVar22);
            pmVar26 = std::
                      map<uint256,_int,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_int>_>_>
                      ::at(&this_01->m_last_range_ends,&prev_tip_hash);
            *pmVar26 = iVar19;
          }
        }
        pCVar6 = this_01->m_wallet->m_chain;
        if (pCVar6 == (Chain *)0x0) goto LAB_00162613;
        uVar20 = (**(code **)(*(long *)pCVar6 + 0x48))(pCVar6,0,&block_hash,&this_01->m_filter_set);
        if ((uVar20 >> 8 & 1) == 0) {
          pLVar28 = LogInstance();
          bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar28,SCAN,Debug);
          bVar17 = true;
          if (bVar16) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&prev_tip_hash,&block_hash);
            logging_function._M_str = "ScanForWalletTransactions";
            logging_function._M_len = 0x19;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
            ;
            source_file._M_len = 0x5a;
            LogPrintf_<int,std::__cxx11::string>
                      (logging_function,source_file,0x78b,
                       I2P|QT|MEMPOOLREJ|PRUNE|SELECTCOINS|ESTIMATEFEE|BENCH|HTTP|TOR|NET,
                       (Level)&block_height,(char *)&prev_tip_hash,(int *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar38,uVar37));
LAB_00161cab:
            bVar17 = bVar12;
            if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
                prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
              operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                              prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
            }
          }
        }
        else if ((uVar20 & 1) == 0) {
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x10) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x18) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8)
               = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          (args->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> =
               (_Optional_payload_base<int>)((ulong)(uint)block_height | 0x100000000);
          bVar17 = false;
        }
        else {
          pLVar28 = LogInstance();
          bVar16 = BCLog::Logger::WillLogCategoryLevel(pLVar28,SCAN,Debug);
          if (bVar16) {
            base_blob<256u>::ToString_abi_cxx11_((string *)&prev_tip_hash,&block_hash);
            logging_function_00._M_str = "ScanForWalletTransactions";
            logging_function_00._M_len = 0x19;
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
            ;
            source_file_00._M_len = 0x5a;
            LogPrintf_<int,std::__cxx11::string>
                      (logging_function_00,source_file_00,0x784,
                       I2P|QT|MEMPOOLREJ|PRUNE|SELECTCOINS|RPC|WALLETDB|ZMQ|MEMPOOL|TOR,
                       (Level)&block_height,(char *)&prev_tip_hash,(int *)args,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(uVar38,uVar37));
            goto LAB_00161cab;
          }
        }
      }
      block_still_active = false;
      next_block = false;
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      pCVar6 = this->m_chain;
      if (pCVar6 == (Chain *)0x0) goto LAB_00162613;
      local_170 = 0;
      stack0xfffffffffffffe60 = ZEXT816(0);
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ = ZEXT816(0);
      auStack_188 = (undefined1  [8])0x0;
      local_190 = (undefined1  [8])&block_still_active;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = &next_block_hash;
      local_180._8_8_ = 0;
      local_180._0_8_ = &loc;
      (**(code **)(*(long *)pCVar6 + 0x50))(pCVar6,&block_hash,&prev_tip_hash);
      if (bVar17) {
        local_168._16_3_ = 0;
        uStack_155 = 0;
        local_168._0_8_ = (pointer)0x0;
        local_168._8_3_ = 0;
        local_168._11_5_ = 0;
        local_170 = 0;
        local_180 = ZEXT816(0);
        _local_190 = ZEXT816(0);
        stack0xfffffffffffffe60 = ZEXT816(0);
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
        prev_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ = ZEXT816(0);
        pCVar6 = this->m_chain;
        if (pCVar6 == (Chain *)0x0) goto LAB_00162613;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (**(code **)(*(long *)pCVar6 + 0x50))(pCVar6,&block_hash,&loc);
        if ((int)local_170 == 0) {
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x10
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 0x18
           ) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8) =
               block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          args->status = FAILURE;
        }
        else {
          criticalblock43.super_unique_lock._M_owns = false;
          criticalblock43.super_unique_lock._M_device = &pRVar39->super_recursive_mutex;
          std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
          if (block_still_active != true) {
            *(undefined8 *)
             ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems +
             0x10) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
            *(undefined8 *)
             ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems +
             0x18) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
            *(undefined8 *)
             (__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems =
                 block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
            *(undefined8 *)
             ((__return_storage_ptr__->last_failed_block).super_base_blob<256U>.m_data._M_elems + 8)
                 = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
            args->status = FAILURE;
            std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock)
            ;
            std::
            vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       *)local_168);
            break;
          }
          if ((pointer)CONCAT53(local_168._11_5_,local_168._8_3_) != (pointer)local_168._0_8_) {
            lVar32 = 0;
            uVar31 = 0;
            do {
              ptx = (CTransactionRef *)
                    ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                            local_168._0_8_)->_M_ptr + lVar32);
              loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
              loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
              loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
              bVar17 = AddToWalletIfInvolvingMe(this,ptx,(SyncTxState *)&loc,fUpdate,true);
              if (bVar17) {
                MarkInputsDirty(this,ptx);
              }
              uVar31 = uVar31 + 1;
              lVar32 = lVar32 + 0x10;
            } while (uVar31 < (ulong)(CONCAT53(local_168._11_5_,local_168._8_3_) - local_168._0_8_
                                     >> 4));
          }
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x10) = block_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems +
           0x18) = block_hash.super_base_blob<256U>.m_data._M_elems._24_8_;
          *(undefined8 *)
           (__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems =
               block_hash.super_base_blob<256U>.m_data._M_elems._0_8_;
          *(undefined8 *)
           ((__return_storage_ptr__->last_scanned_block).super_base_blob<256U>.m_data._M_elems + 8)
               = block_hash.super_base_blob<256U>.m_data._M_elems._8_8_;
          (args->last_scanned_height).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int> =
               (_Optional_payload_base<int>)((ulong)(uint)block_height | 0x100000000);
          if (save_progress && lVar3 <= (long)tVar29.__d.__r) {
            (**(code **)(*(long *)this->m_chain + 0x30))(&loc,this->m_chain,&block_hash);
            if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start !=
                loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              WalletLogPrintf<int>(this,"Saving scan progress %d.\n",block_height);
              pWVar8 = (this->m_database)._M_t.
                       super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
                       .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
              if (pWVar8 == (WalletDatabase *)0x0) {
                __assert_fail("static_cast<bool>(m_database)",
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                              ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const")
                ;
              }
              (*pWVar8->_vptr_WalletDatabase[0xe])(&local_1d0,pWVar8,1);
              local_1d0.m_database = pWVar8;
              WalletBatch::WriteBestBlock(&local_1d0,&loc);
              if ((_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)
                  local_1d0.m_batch._M_t.
                  super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                  .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
                  (_Head_base<0UL,_wallet::DatabaseBatch_*,_false>)0x0) {
                (*(*(_func_int ***)
                    local_1d0.m_batch._M_t.
                    super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                    .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl)[5])();
              }
            }
            if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
          }
          std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
        }
        std::
        vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                   *)local_168);
      }
      if ((max_height.super__Optional_base<int,_true,_true>._M_payload.
           super__Optional_payload_base<int>._M_payload <= block_height &&
           ((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int> & 0x100000000) != 0) || (next_block != true))
      break;
      block_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x10];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x11];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x12];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x13];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x14];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x15];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x16];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x17];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x18];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x19];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
      block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
      block_hash.super_base_blob<256U>.m_data._M_elems[0] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0];
      block_hash.super_base_blob<256U>.m_data._M_elems[1] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[1];
      block_hash.super_base_blob<256U>.m_data._M_elems[2] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[2];
      block_hash.super_base_blob<256U>.m_data._M_elems[3] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[3];
      block_hash.super_base_blob<256U>.m_data._M_elems[4] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[4];
      block_hash.super_base_blob<256U>.m_data._M_elems[5] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[5];
      block_hash.super_base_blob<256U>.m_data._M_elems[6] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[6];
      block_hash.super_base_blob<256U>.m_data._M_elems[7] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[7];
      block_hash.super_base_blob<256U>.m_data._M_elems[8] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[8];
      block_hash.super_base_blob<256U>.m_data._M_elems[9] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[9];
      block_hash.super_base_blob<256U>.m_data._M_elems[10] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[10];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xb];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xc];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xd];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xe];
      block_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           next_block_hash.super_base_blob<256U>.m_data._M_elems[0xf];
      block_height = block_height + 1;
      if (this->m_chain == (Chain *)0x0) goto LAB_00162613;
      uVar34 = (**(code **)(*(long *)this->m_chain + 0x80))();
      auVar11 = (undefined1  [16])tip_hash.super_base_blob<256U>.m_data._M_elems._0_16_;
      uVar37 = (undefined4)uVar34;
      uVar38 = (undefined4)((ulong)uVar34 >> 0x20);
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x18] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x18];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x19];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[1] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[1];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[2] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[2];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[3] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[3];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[4] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[4];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[5] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[5];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[6] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[6];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[7] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[7];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[8] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[8];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[9];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[10];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
      criticalblock43.super_unique_lock._M_owns = false;
      criticalblock43.super_unique_lock._M_device = &pRVar39->super_recursive_mutex;
      tip_hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar11;
      std::unique_lock<std::recursive_mutex>::lock(&criticalblock43.super_unique_lock);
      if (this->m_last_block_processed_height < 0) goto LAB_001625ac;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start =
           *(pointer *)(this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish =
           *(pointer *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
      loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10)
      ;
      uVar34 = *(undefined8 *)
                ((this->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock43.super_unique_lock);
      auVar9._8_8_ = loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish;
      auVar9._0_8_ = loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_start;
      tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ =
           loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      uVar14 = tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_;
      tip_hash.super_base_blob<256U>.m_data._M_elems._0_16_ = auVar9;
      tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = uVar14;
      tip_hash.super_base_blob<256U>.m_data._M_elems._24_8_ = uVar34;
      if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> & 0x100000000) == 0) {
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] =
             (uchar)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 8);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x10);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x18);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x20);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x28);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x30);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage >> 0x38);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (uchar)uVar34;
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x19] = SUB81(uVar34,1);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a] = SUB81(uVar34,2);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b] = SUB81(uVar34,3);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c] = SUB81(uVar34,4);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d] = SUB81(uVar34,5);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e] = SUB81(uVar34,6);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f] = SUB81(uVar34,7);
        auVar36[0] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x10]);
        auVar36[1] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x11]);
        auVar36[2] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x12]);
        auVar36[3] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x13]);
        auVar36[4] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x14]);
        auVar36[5] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x15]);
        auVar36[6] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x16]);
        auVar36[7] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x17]);
        auVar36[8] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x18] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x18]);
        auVar36[9] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x19] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0x19]);
        auVar36[10] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                       tip_hash.super_base_blob<256U>.m_data._M_elems[0x1a]);
        auVar36[0xb] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1b]);
        auVar36[0xc] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1c]);
        auVar36[0xd] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1d]);
        auVar36[0xe] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1e]);
        auVar36[0xf] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0x1f]);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0] =
             (uchar)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start;
        tip_hash.super_base_blob<256U>.m_data._M_elems[1] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 8);
        tip_hash.super_base_blob<256U>.m_data._M_elems[2] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x10);
        tip_hash.super_base_blob<256U>.m_data._M_elems[3] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x18);
        tip_hash.super_base_blob<256U>.m_data._M_elems[4] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x20);
        tip_hash.super_base_blob<256U>.m_data._M_elems[5] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x28);
        tip_hash.super_base_blob<256U>.m_data._M_elems[6] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x30);
        tip_hash.super_base_blob<256U>.m_data._M_elems[7] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_start >> 0x38);
        tip_hash.super_base_blob<256U>.m_data._M_elems[8] =
             (uchar)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_finish;
        tip_hash.super_base_blob<256U>.m_data._M_elems[9] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 8);
        tip_hash.super_base_blob<256U>.m_data._M_elems[10] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x10);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x18);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x20);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x28);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x30);
        tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] =
             (uchar)((ulong)loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                            super__Vector_impl_data._M_finish >> 0x38);
        auVar35[0] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[0]);
        auVar35[1] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[1] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[1]);
        auVar35[2] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[2] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[2]);
        auVar35[3] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[3] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[3]);
        auVar35[4] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[4] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[4]);
        auVar35[5] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[5] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[5]);
        auVar35[6] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[6] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[6]);
        auVar35[7] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[7] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[7]);
        auVar35[8] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[8] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[8]);
        auVar35[9] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9] ==
                      tip_hash.super_base_blob<256U>.m_data._M_elems[9]);
        auVar35[10] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10] ==
                       tip_hash.super_base_blob<256U>.m_data._M_elems[10]);
        auVar35[0xb] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xb]);
        auVar35[0xc] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xc]);
        auVar35[0xd] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xd]);
        auVar35[0xe] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xe]);
        auVar35[0xf] = -(prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf] ==
                        tip_hash.super_base_blob<256U>.m_data._M_elems[0xf]);
        auVar35 = auVar35 & auVar36;
        if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) != 0xffff) {
          if (this->m_chain == (Chain *)0x0) goto LAB_00162613;
          local_1f8 = (double)(**(code **)(*(long *)this->m_chain + 0x80))();
        }
      }
      if (((this->fAbortRescan)._M_base._M_i & 1U) != 0) break;
    } while( true );
  }
  if (((ulong)max_height.super__Optional_base<int,_true,_true>._M_payload.
              super__Optional_payload_base<int> & 0x100000000) == 0) {
    WalletLogPrintf<>(this,"Scanning current mempool transactions.\n");
    auVar10[0xf] = 0;
    auVar10[0] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[9];
    auVar10[1] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[10];
    auVar10[2] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xb];
    auVar10[3] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xc];
    auVar10[4] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xd];
    auVar10[5] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xe];
    auVar10[6] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0xf];
    auVar10[7] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x10];
    auVar10[8] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x11];
    auVar10[9] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x12];
    auVar10[10] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x13];
    auVar10[0xb] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x14];
    auVar10[0xc] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x15];
    auVar10[0xd] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x16];
    auVar10[0xe] = prev_tip_hash.super_base_blob<256U>.m_data._M_elems[0x17];
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._8_16_ = auVar10 << 8;
    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = pRVar39;
    std::unique_lock<std::recursive_mutex>::lock
              ((unique_lock<std::recursive_mutex> *)&prev_tip_hash);
    pCVar6 = this->m_chain;
    if (pCVar6 == (Chain *)0x0) goto LAB_00162613;
    (**(code **)(*(long *)pCVar6 + 0x1a0))(pCVar6,&this->super_Notifications);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&prev_tip_hash);
  }
  prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ =
       prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&prev_tip_hash,anon_var_dwarf_239dee,anon_var_dwarf_239dee + 0xd);
  if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
    auStack_198 = (undefined1  [8])(local_190 + 8);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)auStack_198,anon_var_dwarf_239dee,anon_var_dwarf_239dee + 0xd);
  }
  else {
    criticalblock43.super_unique_lock._M_device = (mutex_type *)anon_var_dwarf_239dee;
    (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_198,
               (_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,(char **)&criticalblock43);
  }
  pbVar24 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       auStack_198,0,0,"%s ",3);
  puVar4 = next_block_hash.super_base_blob<256U>.m_data._M_elems + 0x10;
  next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar24->_M_dataplus)._M_p;
  pbVar30 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pbVar24->field_2;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ == pbVar30) {
    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar30;
    next_block_hash.super_base_blob<256U>.m_data._M_elems._24_8_ =
         *(undefined8 *)((long)&pbVar24->field_2 + 8);
    next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ = puVar4;
  }
  else {
    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ = *(undefined8 *)pbVar30;
  }
  next_block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar24->_M_string_length;
  (pbVar24->_M_dataplus)._M_p = (pointer)pbVar30;
  pbVar24->_M_string_length = 0;
  (pbVar24->field_2)._M_local_buf[0] = '\0';
  GetDisplayName_abi_cxx11_((string *)&criticalblock43,this);
  tinyformat::format<std::__cxx11::string>
            ((string *)&loc,(tinyformat *)&next_block_hash,(string *)&criticalblock43,pbVar30);
  boost::signals2::
  signal<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::function<void_(const_boost::signals2::connection_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_boost::signals2::mutex>
  ::operator()(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&loc,100
              );
  if (loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)&loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
    operator_delete(loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)(((loc.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                            super_base_blob<256U>).m_data._M_elems + 1));
  }
  if (criticalblock43.super_unique_lock._M_device != (mutex_type *)local_e8) {
    operator_delete(criticalblock43.super_unique_lock._M_device,local_e8._0_8_ + 1);
  }
  if ((uchar *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_ != puVar4) {
    operator_delete((void *)next_block_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    next_block_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if (auStack_198 != (undefined1  [8])(local_190 + 8)) {
    operator_delete((void *)auStack_198,(long)auStack_188 + 1);
  }
  if ((uchar *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_ !=
      prev_tip_hash.super_base_blob<256U>.m_data._M_elems + 0x10) {
    operator_delete((void *)prev_tip_hash.super_base_blob<256U>.m_data._M_elems._0_8_,
                    prev_tip_hash.super_base_blob<256U>.m_data._M_elems._16_8_ + 1);
  }
  if (block_height != 0) {
    if (((this->fAbortRescan)._M_base._M_i & 1U) != 0) {
      __ptr = "Rescan aborted at block %d. Progress=%f\n";
LAB_00162453:
      WalletLogPrintf<int,double>(this,__ptr,block_height,(double)CONCAT44(uVar38,uVar37));
      args->status = USER_ABORT;
      goto LAB_001624b6;
    }
    if (block_height != 0) {
      if (this->m_chain == (Chain *)0x0) goto LAB_00162613;
      cVar15 = (**(code **)(*(long *)this->m_chain + 0x120))();
      if (cVar15 != '\0') {
        __ptr = "Rescan interrupted by shutdown request at block %d. Progress=%f\n";
        goto LAB_00162453;
      }
    }
  }
  if ((reserver->m_now).super__Function_base._M_manager == (_Manager_type)0x0) {
    tVar29.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  else {
    tVar29 = (*(reserver->m_now)._M_invoker)((_Any_data *)&reserver->m_now);
  }
  __ptr = "Rescan completed in %15dms\n";
  WalletLogPrintf<long>
            (this,"Rescan completed in %15dms\n",
             ((long)tVar29.__d.__r - (long)tVar21.__d.__r) / 1000000);
LAB_001624b6:
  if (this_01 != (FastWalletRescanFilter *)0x0) {
    std::default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter>::operator()
              ((default_delete<wallet::(anonymous_namespace)::FastWalletRescanFilter> *)this_01,
               (FastWalletRescanFilter *)__ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return args;
}

Assistant:

CWallet::ScanResult CWallet::ScanForWalletTransactions(const uint256& start_block, int start_height, std::optional<int> max_height, const WalletRescanReserver& reserver, bool fUpdate, const bool save_progress)
{
    constexpr auto INTERVAL_TIME{60s};
    auto current_time{reserver.now()};
    auto start_time{reserver.now()};

    assert(reserver.isReserved());

    uint256 block_hash = start_block;
    ScanResult result;

    std::unique_ptr<FastWalletRescanFilter> fast_rescan_filter;
    if (!IsLegacy() && chain().hasBlockFilterIndex(BlockFilterType::BASIC)) fast_rescan_filter = std::make_unique<FastWalletRescanFilter>(*this);

    WalletLogPrintf("Rescan started from block %s... (%s)\n", start_block.ToString(),
                    fast_rescan_filter ? "fast variant using block filters" : "slow variant inspecting all blocks");

    fAbortRescan = false;
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 0); // show rescan progress in GUI as dialog or on splashscreen, if rescan required on startup (e.g. due to corruption)
    uint256 tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
    uint256 end_hash = tip_hash;
    if (max_height) chain().findAncestorByHeight(tip_hash, *max_height, FoundBlock().hash(end_hash));
    double progress_begin = chain().guessVerificationProgress(block_hash);
    double progress_end = chain().guessVerificationProgress(end_hash);
    double progress_current = progress_begin;
    int block_height = start_height;
    while (!fAbortRescan && !chain().shutdownRequested()) {
        if (progress_end - progress_begin > 0.0) {
            m_scanning_progress = (progress_current - progress_begin) / (progress_end - progress_begin);
        } else { // avoid divide-by-zero for single block scan range (i.e. start and stop hashes are equal)
            m_scanning_progress = 0;
        }
        if (block_height % 100 == 0 && progress_end - progress_begin > 0.0) {
            ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), std::max(1, std::min(99, (int)(m_scanning_progress * 100))));
        }

        bool next_interval = reserver.now() >= current_time + INTERVAL_TIME;
        if (next_interval) {
            current_time = reserver.now();
            WalletLogPrintf("Still rescanning. At block %d. Progress=%f\n", block_height, progress_current);
        }

        bool fetch_block{true};
        if (fast_rescan_filter) {
            fast_rescan_filter->UpdateIfNeeded();
            auto matches_block{fast_rescan_filter->MatchesBlock(block_hash)};
            if (matches_block.has_value()) {
                if (*matches_block) {
                    LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (filter matched)\n", block_height, block_hash.ToString());
                } else {
                    result.last_scanned_block = block_hash;
                    result.last_scanned_height = block_height;
                    fetch_block = false;
                }
            } else {
                LogDebug(BCLog::SCAN, "Fast rescan: inspect block %d [%s] (WARNING: block filter not found!)\n", block_height, block_hash.ToString());
            }
        }

        // Find next block separately from reading data above, because reading
        // is slow and there might be a reorg while it is read.
        bool block_still_active = false;
        bool next_block = false;
        uint256 next_block_hash;
        chain().findBlock(block_hash, FoundBlock().inActiveChain(block_still_active).nextBlock(FoundBlock().inActiveChain(next_block).hash(next_block_hash)));

        if (fetch_block) {
            // Read block data
            CBlock block;
            chain().findBlock(block_hash, FoundBlock().data(block));

            if (!block.IsNull()) {
                LOCK(cs_wallet);
                if (!block_still_active) {
                    // Abort scan if current block is no longer active, to prevent
                    // marking transactions as coming from the wrong block.
                    result.last_failed_block = block_hash;
                    result.status = ScanResult::FAILURE;
                    break;
                }
                for (size_t posInBlock = 0; posInBlock < block.vtx.size(); ++posInBlock) {
                    SyncTransaction(block.vtx[posInBlock], TxStateConfirmed{block_hash, block_height, static_cast<int>(posInBlock)}, fUpdate, /*rescanning_old_block=*/true);
                }
                // scan succeeded, record block as most recent successfully scanned
                result.last_scanned_block = block_hash;
                result.last_scanned_height = block_height;

                if (save_progress && next_interval) {
                    CBlockLocator loc = m_chain->getActiveChainLocator(block_hash);

                    if (!loc.IsNull()) {
                        WalletLogPrintf("Saving scan progress %d.\n", block_height);
                        WalletBatch batch(GetDatabase());
                        batch.WriteBestBlock(loc);
                    }
                }
            } else {
                // could not scan block, keep scanning but record this block as the most recent failure
                result.last_failed_block = block_hash;
                result.status = ScanResult::FAILURE;
            }
        }
        if (max_height && block_height >= *max_height) {
            break;
        }
        {
            if (!next_block) {
                // break successfully when rescan has reached the tip, or
                // previous block is no longer on the chain due to a reorg
                break;
            }

            // increment block and verification progress
            block_hash = next_block_hash;
            ++block_height;
            progress_current = chain().guessVerificationProgress(block_hash);

            // handle updated tip hash
            const uint256 prev_tip_hash = tip_hash;
            tip_hash = WITH_LOCK(cs_wallet, return GetLastBlockHash());
            if (!max_height && prev_tip_hash != tip_hash) {
                // in case the tip has changed, update progress max
                progress_end = chain().guessVerificationProgress(tip_hash);
            }
        }
    }
    if (!max_height) {
        WalletLogPrintf("Scanning current mempool transactions.\n");
        WITH_LOCK(cs_wallet, chain().requestMempoolTransactions(*this));
    }
    ShowProgress(strprintf("%s " + _("Rescanning…").translated, GetDisplayName()), 100); // hide progress dialog in GUI
    if (block_height && fAbortRescan) {
        WalletLogPrintf("Rescan aborted at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else if (block_height && chain().shutdownRequested()) {
        WalletLogPrintf("Rescan interrupted by shutdown request at block %d. Progress=%f\n", block_height, progress_current);
        result.status = ScanResult::USER_ABORT;
    } else {
        WalletLogPrintf("Rescan completed in %15dms\n", Ticks<std::chrono::milliseconds>(reserver.now() - start_time));
    }
    return result;
}